

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focus_attack_strategy.cpp
# Opt level: O0

void __thiscall
FocusAttackStrategy::generateActions(FocusAttackStrategy *this,PlayerSight *sight,Actions *actions)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  Vec2 pos;
  bool bVar4;
  bool bVar5;
  reference pPVar6;
  float fVar7;
  Vec2 local_b8;
  Vec2 local_b0;
  Vec2 local_a4;
  int local_9c;
  undefined1 auStack_98 [4];
  PUnitInfo uinfo_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<PUnitInfo,_std::allocator<PUnitInfo>_> *__range1_1;
  Vec2 local_64;
  undefined1 local_5c [8];
  PUnitInfo uinfo;
  const_iterator __end1;
  const_iterator __begin1;
  vector<PUnitInfo,_std::allocator<PUnitInfo>_> *__range1;
  float local_28;
  int nearest;
  float dist;
  bool found;
  Actions *actions_local;
  PlayerSight *sight_local;
  FocusAttackStrategy *this_local;
  
  if ((this->field_0xc & 1) == 0) {
    bVar5 = false;
    local_28 = 1e+08;
    __range1._4_4_ = -1;
    __end1 = std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::begin(&sight->unitInSight);
    uinfo.velocity =
         (Vec2)std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::end(&sight->unitInSight);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>
                                       *)&uinfo.velocity), bVar4) {
      pPVar6 = __gnu_cxx::
               __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>
               ::operator*(&__end1);
      local_5c._0_4_ = pPVar6->id;
      local_5c._4_4_ = (pPVar6->pos).x;
      uinfo._0_8_ = *(undefined8 *)&(pPVar6->pos).y;
      uinfo.pos.y = (pPVar6->velocity).y;
      if (local_5c._0_4_ == this->target) {
        bVar5 = true;
        break;
      }
      local_64 = Vec2::operator-((Vec2 *)(local_5c + 4),&sight->pos);
      fVar7 = Vec2::length(&local_64);
      if (fVar7 < local_28) {
        register0x00001200 = Vec2::operator-((Vec2 *)(local_5c + 4),&sight->pos);
        local_28 = Vec2::length((Vec2 *)((long)&__range1_1 + 4));
        __range1._4_4_ = local_5c._0_4_;
      }
      __gnu_cxx::
      __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>::
      operator++(&__end1);
    }
    if (!bVar5) {
      this->target = __range1._4_4_;
    }
    if (this->target != -1) {
      __end1_1 = std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::begin(&sight->unitInSight);
      uinfo_1.velocity =
           (Vec2)std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>::end(&sight->unitInSight);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>
                                 *)&uinfo_1.velocity), bVar5) {
        pPVar6 = __gnu_cxx::
                 __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>
                 ::operator*(&__end1_1);
        uVar1 = pPVar6->id;
        uVar3 = (pPVar6->pos).x;
        uVar2 = *(undefined8 *)&(pPVar6->pos).y;
        uinfo_1.id = (int)uVar2;
        uinfo_1.pos.x = (float)((ulong)uVar2 >> 0x20);
        uinfo_1.pos.y = (pPVar6->velocity).y;
        local_9c = uVar1;
        auStack_98 = (undefined1  [4])uVar3;
        if (uVar1 == this->target) {
          bVar5 = false;
          if ((sight->canSuckAttack & 1U) != 0) {
            local_a4 = Vec2::operator-((Vec2 *)auStack_98,&sight->pos);
            fVar7 = Vec2::length(&local_a4);
            bVar5 = fVar7 <= 4.0;
          }
          if (bVar5) {
            local_b0.y = (float)uinfo_1.id;
            local_b0.x = (float)auStack_98;
            Actions::emplace(actions,SuckAttack,this->target,local_b0);
          }
          if ((sight->canUseBomb & 1U) != 0) {
            if (sight->bombCount == 0) {
              Vec2::Vec2(&local_b8,0.0,0.0);
              Actions::emplace(actions,BuyItem,0,local_b8);
            }
            pos.y = (float)uinfo_1.id;
            pos.x = (float)auStack_98;
            Actions::emplace(actions,UseItem,0,pos);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_PUnitInfo_*,_std::vector<PUnitInfo,_std::allocator<PUnitInfo>_>_>::
        operator++(&__end1_1);
      }
    }
  }
  return;
}

Assistant:

void FocusAttackStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    bool found = false;
    float dist = FINF;
    int nearest = -1;
    for (auto uinfo : sight.unitInSight)
    {
        if (uinfo.id == target)
        {
            found = true;
            break;
        }
        if ((uinfo.pos - sight.pos).length() < dist)
        {
            dist = (uinfo.pos - sight.pos).length();
            nearest = uinfo.id;
        }
    }
    if (!found)
        target = nearest;
    if (target == -1)
        return;
    
    for (auto uinfo : sight.unitInSight)
    {
        if (uinfo.id != target)
            continue;
        if (sight.canSuckAttack && (uinfo.pos - sight.pos).length() <= SuckRange)
            actions->emplace(SuckAttack, target, uinfo.pos);
        if (sight.canUseBomb)
        {
            if (sight.bombCount == 0)
                actions->emplace(BuyItem, BombItem, Vec2());
            actions->emplace(UseItem, BombItem, uinfo.pos);
        }
    }
}